

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_sm.c
# Opt level: O0

void btokSMCtrInc(void *state)

{
  ulong uVar1;
  size_t pos;
  word carry;
  btok_sm_st *st;
  void *state_local;
  
  carry = 1;
  for (pos = 0; pos < 0x10; pos = pos + 1) {
    uVar1 = *(byte *)((long)state + pos + 0x40) + carry;
    *(char *)((long)state + pos + 0x40) = (char)uVar1;
    carry = uVar1 >> 8;
  }
  return;
}

Assistant:

void btokSMCtrInc(void* state)
{
	btok_sm_st* st = (btok_sm_st*)state;
	register word carry = 1;
	size_t pos;
	// pre
	ASSERT(memIsValid(state, btokSM_keep()));
	// инкремент
	for (pos = 0; pos < 16; ++pos)
		carry += st->ctr[pos], st->ctr[pos] = (octet)carry, carry >>= 8;
	carry = 0;
}